

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::RandomOrderTexImage2DCase::createTexture(RandomOrderTexImage2DCase *this)

{
  ContextWrapper *this_00;
  TextureFormatInfo *minVal;
  Vec4 *maxVal;
  int level;
  int internalFormat;
  deUint32 type;
  deUint32 dVar1;
  byte bVar2;
  int i;
  long lVar3;
  int local_f8;
  int local_f4;
  deUint32 tex;
  vector<int,_std::allocator<int>_> levels;
  Random rnd;
  TextureLevel levelData;
  Vec4 gMax;
  Vec4 gMin;
  PixelBufferAccess local_58;
  
  tex = 0;
  local_58.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_58);
  dVar1 = deStringHash((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar1);
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  std::vector<int,_std::allocator<int>_>::vector
            (&levels,(long)(this->super_Texture2DSpecCase).m_numLevels,(allocator_type *)&local_58);
  for (lVar3 = 0; lVar3 < (this->super_Texture2DSpecCase).m_numLevels; lVar3 = lVar3 + 1) {
    levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar3] = (int)lVar3;
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&rnd,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  minVal = &(this->super_Texture2DSpecCase).m_texFormatInfo;
  maxVal = &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax;
  for (lVar3 = 0; lVar3 < (this->super_Texture2DSpecCase).m_numLevels; lVar3 = lVar3 + 1) {
    level = levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar3];
    bVar2 = (byte)level;
    local_f4 = (this->super_Texture2DSpecCase).m_width >> (bVar2 & 0x1f);
    if (local_f4 < 2) {
      local_f4 = 1;
    }
    local_f8 = (this->super_Texture2DSpecCase).m_height >> (bVar2 & 0x1f);
    if (local_f8 < 2) {
      local_f8 = 1;
    }
    randomVector<4>((Functional *)&gMin,&rnd,&minVal->valueMin,maxVal);
    randomVector<4>((Functional *)&gMax,&rnd,&minVal->valueMin,maxVal);
    tcu::TextureLevel::setSize(&levelData,local_f4,local_f8,1);
    tcu::TextureLevel::getAccess(&local_58,&levelData);
    tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
    internalFormat = *(int *)&(this->super_Texture2DSpecCase).field_0xd4;
    dVar1 = this->m_format;
    type = this->m_dataType;
    tcu::TextureLevel::getAccess(&local_58,&levelData);
    sglr::ContextWrapper::glTexImage2D
              (this_00,0xde1,level,internalFormat,local_f4,local_f8,0,dVar1,type,
               local_58.super_ConstPixelBufferAccess.m_data);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&levels.super__Vector_base<int,_std::allocator<int>_>);
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(m_format, m_dataType));
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		vector<int>			levels		(m_numLevels);

		for (int i = 0; i < m_numLevels; i++)
			levels[i] = i;
		rnd.shuffle(levels.begin(), levels.end());

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelNdx	= levels[ndx];
			int		levelW		= de::max(1, m_width	>> levelNdx);
			int		levelH		= de::max(1, m_height	>> levelNdx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, levelNdx, m_internalFormat, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}